

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::join(CBString *this,CBStringList *l,char sep)

{
  undefined8 uVar1;
  CBStringException *pCVar2;
  size_type sVar3;
  const_reference pvVar4;
  allocator local_121;
  string local_120;
  undefined1 local_100 [8];
  CBStringException bstr__cppwrapper_exception_2;
  string local_d0;
  undefined1 local_b0 [8];
  CBStringException bstr__cppwrapper_exception_1;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  CBStringException bstr__cppwrapper_exception;
  size_t i;
  int c;
  char sep_local;
  CBStringList *l_local;
  CBString *this_local;
  
  if ((this->super_tagbstring).mlen < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"CBString::Write protection error",&local_71);
    CBStringException::CBStringException((CBStringException *)local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,(CBStringException *)local_50);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  i._0_4_ = 1;
  bstr__cppwrapper_exception.msg.field_2._8_8_ = 0;
  while( true ) {
    uVar1 = bstr__cppwrapper_exception.msg.field_2._8_8_;
    sVar3 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::size
                      ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l);
    if (sVar3 <= (ulong)uVar1) {
      alloc(this,(int)i);
      (this->super_tagbstring).slen = 0;
      if ((this->super_tagbstring).data == (uchar *)0x0) {
        (this->super_tagbstring).slen = 0;
        (this->super_tagbstring).mlen = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_120,"CBString::Failure in (CBStringList) constructor",&local_121
                  );
        CBStringException::CBStringException((CBStringException *)local_100,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
        CBStringException::CBStringException(pCVar2,(CBStringException *)local_100);
        __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
      }
      bstr__cppwrapper_exception.msg.field_2._8_8_ = 0;
      while( true ) {
        uVar1 = bstr__cppwrapper_exception.msg.field_2._8_8_;
        sVar3 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::size
                          ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l);
        if (sVar3 <= (ulong)uVar1) break;
        if (bstr__cppwrapper_exception.msg.field_2._8_8_ != 0) {
          operator+=(this,sep);
        }
        pvVar4 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                           ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,
                            bstr__cppwrapper_exception.msg.field_2._8_8_);
        operator+=(this,pvVar4);
        bstr__cppwrapper_exception.msg.field_2._8_8_ =
             bstr__cppwrapper_exception.msg.field_2._8_8_ + 1;
      }
      return;
    }
    pvVar4 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                       ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,
                        bstr__cppwrapper_exception.msg.field_2._8_8_);
    i._0_4_ = (pvVar4->super_tagbstring).slen + 1 + (int)i;
    if ((int)i < 1) break;
    bstr__cppwrapper_exception.msg.field_2._8_8_ = bstr__cppwrapper_exception.msg.field_2._8_8_ + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"CBString::Failure in (CBStringList) constructor, too long",
             (allocator *)(bstr__cppwrapper_exception_2.msg.field_2._M_local_buf + 0xf));
  CBStringException::CBStringException((CBStringException *)local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(bstr__cppwrapper_exception_2.msg.field_2._M_local_buf + 0xf));
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,(CBStringException *)local_b0);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::join (const struct CBStringList& l, char sep) {
int c;
size_t i;

	if (mlen <= 0) {
		bstringThrow ("Write protection error");
	}

	for (c=1, i=0; i < l.size(); i++) {
		c += l.at(i).slen + 1;
		if (c <= 0) bstringThrow ("Failure in (CBStringList) constructor, too long");
	}

	alloc (c);
	slen = 0;
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in (CBStringList) constructor");
	} else {
		for (i=0; i < l.size(); i++) {
			if (i > 0) *this += sep;
			*this += l.at(i);
		}
	}
}